

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ExpressionTemplateToken::~ExpressionTemplateToken(ExpressionTemplateToken *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ExpressionTemplateToken_00429f88;
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x31af9a);
  TemplateToken::~TemplateToken((TemplateToken *)0x31afa4);
  return;
}

Assistant:

ExpressionTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && e) : TemplateToken(Type::Expression, loc, pre, post), expr(std::move(e)) {}